

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

BlockStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BlockStatementSyntax,slang::syntax::SyntaxKind&,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::NamedBlockClauseSyntax*&,slang::syntax::SyntaxList<slang::syntax::SyntaxNode>const&,slang::parsing::Token&,slang::syntax::NamedBlockClauseSyntax*&>
          (BumpAllocator *this,SyntaxKind *args,NamedLabelSyntax **args_1,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2,Token *args_3,
          NamedBlockClauseSyntax **args_4,SyntaxList<slang::syntax::SyntaxNode> *args_5,
          Token *args_6,NamedBlockClauseSyntax **args_7)

{
  Token begin;
  Token end;
  BlockStatementSyntax *this_00;
  
  this_00 = (BlockStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((BlockStatementSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (BlockStatementSyntax *)allocateSlow(this,0xc0,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  begin.kind = args_3->kind;
  begin._2_1_ = args_3->field_0x2;
  begin.numFlags.raw = (args_3->numFlags).raw;
  begin.rawLen = args_3->rawLen;
  begin.info = args_3->info;
  end.kind = args_6->kind;
  end._2_1_ = args_6->field_0x2;
  end.numFlags.raw = (args_6->numFlags).raw;
  end.rawLen = args_6->rawLen;
  end.info = args_6->info;
  slang::syntax::BlockStatementSyntax::BlockStatementSyntax
            (this_00,*args,*args_1,args_2,begin,*args_4,args_5,end,*args_7);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }